

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

size_t __thiscall flexbuffers::Builder::EndMap(Builder *this,size_t start)

{
  size_t vec_len;
  TwoValue *pTVar1;
  reference pvVar2;
  Value *pVVar3;
  anon_union_8_3_83789bcb_for_Value_0 local_58;
  Value vec;
  Value keys;
  TwoValue *dict;
  size_t key;
  size_t len;
  size_t start_local;
  Builder *this_local;
  
  vec_len = MapElementCount(this,start);
  dict = (TwoValue *)start;
  while( true ) {
    pTVar1 = (TwoValue *)
             std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ::size(&this->stack_);
    if (pTVar1 <= dict) {
      pVVar3 = std::
               vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
               data(&this->stack_);
      std::
      sort<flexbuffers::Builder::EndMap(unsigned_long)::TwoValue*,flexbuffers::Builder::EndMap(unsigned_long)::_lambda(flexbuffers::Builder::EndMap(unsigned_long)::TwoValue_const&,flexbuffers::Builder::EndMap(unsigned_long)::TwoValue_const&)_1_>
                ((TwoValue *)(pVVar3 + start),(TwoValue *)(pVVar3 + start) + vec_len,
                 (anon_class_8_1_8991fb9c)this);
      join_0x00000010_0x00000000_ = CreateVector(this,start,vec_len,2,true,false,(Value *)0x0);
      _local_58 = CreateVector(this,start + 1,vec_len,2,false,false,(Value *)&vec.type_);
      std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::resize
                (&this->stack_,start);
      std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
      push_back(&this->stack_,(value_type *)&local_58);
      return local_58.i_;
    }
    pvVar2 = std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ::operator[](&this->stack_,(size_type_conflict)dict);
    if (pvVar2->type_ != FBT_KEY) break;
    dict = (TwoValue *)((long)&(dict->key).field_0 + 2);
  }
  __assert_fail("stack_[key].type_ == FBT_KEY",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x49b,"size_t flexbuffers::Builder::EndMap(size_t)");
}

Assistant:

size_t EndMap(size_t start) {
    // We should have interleaved keys and values on the stack.
    auto len = MapElementCount(start);
    // Make sure keys are all strings:
    for (auto key = start; key < stack_.size(); key += 2) {
      FLATBUFFERS_ASSERT(stack_[key].type_ == FBT_KEY);
    }
    // Now sort values, so later we can do a binary search lookup.
    // We want to sort 2 array elements at a time.
    struct TwoValue {
      Value key;
      Value val;
    };
    // TODO(wvo): strict aliasing?
    // TODO(wvo): allow the caller to indicate the data is already sorted
    // for maximum efficiency? With an assert to check sortedness to make sure
    // we're not breaking binary search.
    // Or, we can track if the map is sorted as keys are added which would be
    // be quite cheap (cheaper than checking it here), so we can skip this
    // step automatically when appliccable, and encourage people to write in
    // sorted fashion.
    // std::sort is typically already a lot faster on sorted data though.
    auto dict = reinterpret_cast<TwoValue *>(stack_.data() + start);
    std::sort(
        dict, dict + len, [&](const TwoValue &a, const TwoValue &b) -> bool {
          auto as = reinterpret_cast<const char *>(buf_.data() + a.key.u_);
          auto bs = reinterpret_cast<const char *>(buf_.data() + b.key.u_);
          auto comp = strcmp(as, bs);
          // We want to disallow duplicate keys, since this results in a
          // map where values cannot be found.
          // But we can't assert here (since we don't want to fail on
          // random JSON input) or have an error mechanism.
          // Instead, we set has_duplicate_keys_ in the builder to
          // signal this.
          // TODO: Have to check for pointer equality, as some sort
          // implementation apparently call this function with the same
          // element?? Why?
          if (!comp && &a != &b) has_duplicate_keys_ = true;
          return comp < 0;
        });
    // First create a vector out of all keys.
    // TODO(wvo): if kBuilderFlagShareKeyVectors is true, see if we can share
    // the first vector.
    auto keys = CreateVector(start, len, 2, true, false);
    auto vec = CreateVector(start + 1, len, 2, false, false, &keys);
    // Remove temp elements and return map.
    stack_.resize(start);
    stack_.push_back(vec);
    return static_cast<size_t>(vec.u_);
  }